

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# best_constant.cc
# Opt level: O2

bool get_best_constant(vw *all,float *best_constant,float *best_constant_loss)

{
  shared_data *psVar1;
  options_i *poVar2;
  element_type *peVar3;
  int iVar4;
  typed_option<float> *ptVar5;
  bool bVar6;
  uint uVar7;
  float fVar8;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  element_type eVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  float fVar13;
  uint uVar14;
  float fVar15;
  string funcName;
  allocator local_a1;
  float local_a0;
  float local_9c;
  undefined1 local_98 [16];
  string local_88 [32];
  undefined1 local_68 [16];
  string local_58;
  undefined1 local_38 [16];
  
  psVar1 = all->sd;
  fVar13 = psVar1->first_observed_label;
  if (((fVar13 == 3.4028235e+38) && (!NAN(fVar13))) || (all->loss == (loss_function *)0x0)) {
    return false;
  }
  fVar15 = (float)(~-(uint)(psVar1->second_observed_label == 3.4028235e+38) &
                  (uint)psVar1->second_observed_label);
  if ((fVar15 == fVar13) && (!NAN(fVar15) && !NAN(fVar13))) {
    return false;
  }
  fVar8 = fVar13;
  if (fVar13 <= fVar15) {
    fVar8 = fVar15;
  }
  local_98 = ZEXT416((uint)fVar8);
  if (fVar13 <= fVar15) {
    fVar15 = fVar13;
  }
  local_a0 = (float)(psVar1->weighted_labels - (double)fVar8 * psVar1->weighted_labeled_examples) /
             (fVar15 - fVar8);
  fVar13 = (float)psVar1->weighted_labeled_examples - local_a0;
  local_9c = local_a0 + fVar13;
  if (local_9c <= 0.0) {
    return false;
  }
  local_68 = ZEXT416((uint)fVar15);
  (**all->loss->_vptr_loss_function)(local_88);
  iVar4 = std::__cxx11::string::compare((char *)local_88);
  if (((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)local_88), iVar4 == 0)) ||
     (iVar4 = std::__cxx11::string::compare((char *)local_88), iVar4 == 0)) {
    fVar15 = (float)all->sd->weighted_labels / (float)all->sd->weighted_labeled_examples;
    uVar7 = local_98._0_4_;
    uVar10 = local_98._4_4_;
    uVar11 = local_98._8_4_;
    uVar12 = local_98._12_4_;
LAB_001cf6bb:
    uVar14 = local_68._0_4_;
  }
  else {
    if (all->sd->is_more_than_two_labels_observed != false) {
LAB_001cf699:
      bVar6 = false;
      goto LAB_001cf75c;
    }
    iVar4 = std::__cxx11::string::compare((char *)local_88);
    if (iVar4 == 0) {
      fVar15 = *(float *)(&DAT_0023aea4 + (ulong)(fVar13 <= local_a0) * 4);
      uVar7 = local_98._0_4_;
      uVar10 = local_98._4_4_;
      uVar11 = local_98._8_4_;
      uVar12 = local_98._12_4_;
      goto LAB_001cf6bb;
    }
    iVar4 = std::__cxx11::string::compare((char *)local_88);
    if (iVar4 == 0) {
      uVar7 = 0x3f800000;
      uVar10 = 0;
      uVar11 = 0;
      uVar12 = 0;
      if (local_a0 <= 0.0) {
        uVar14 = 0xbf800000;
        fVar15 = 1.0;
      }
      else {
        fVar15 = -1.0;
        uVar14 = 0xbf800000;
        if (0.0 < fVar13) {
          fVar15 = logf(fVar13 / local_a0);
          uVar14 = 0xbf800000;
          uVar7 = 0x3f800000;
          uVar10 = 0;
          uVar11 = 0;
          uVar12 = 0;
        }
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)local_88);
      if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)local_88), iVar4 != 0)) &&
         (iVar4 = std::__cxx11::string::compare((char *)local_88), iVar4 != 0)) goto LAB_001cf699;
      poVar2 = all->options;
      std::__cxx11::string::string((string *)&local_58,"quantile_tau",&local_a1);
      iVar4 = (*poVar2->_vptr_options_i[1])(poVar2,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if ((char)iVar4 == '\0') {
        fVar15 = 0.5;
      }
      else {
        poVar2 = all->options;
        std::__cxx11::string::string((string *)&local_58,"quantile_tau",&local_a1);
        ptVar5 = VW::config::options_i::get_typed_option<float>(poVar2,&local_58);
        peVar3 = (ptVar5->m_value).super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar3 == (element_type *)0x0) {
          eVar9 = 0.0;
        }
        else {
          eVar9 = *peVar3;
        }
        local_38 = ZEXT416((uint)eVar9);
        std::__cxx11::string::~string((string *)&local_58);
        fVar15 = local_38._0_4_;
      }
      uVar7 = -(uint)(fVar15 * local_9c < fVar13);
      fVar15 = (float)(~uVar7 & local_68._0_4_ | uVar7 & local_98._0_4_);
      uVar7 = local_98._0_4_;
      uVar10 = local_98._4_4_;
      uVar11 = local_98._8_4_;
      uVar12 = local_98._12_4_;
      uVar14 = local_68._0_4_;
    }
  }
  *best_constant = fVar15;
  if (all->sd->is_more_than_two_labels_observed == false) {
    fVar8 = 0.0;
    if (0.0 < local_a0) {
      local_98._4_4_ = uVar10;
      local_98._0_4_ = uVar7;
      local_98._8_4_ = uVar11;
      local_98._12_4_ = uVar12;
      (*all->loss->_vptr_loss_function[1])(fVar15,uVar14);
      fVar8 = local_a0 * extraout_XMM0_Da;
      uVar7 = local_98._0_4_;
    }
    fVar15 = 0.0;
    *best_constant_loss = fVar8;
    if (0.0 < fVar13) {
      (*all->loss->_vptr_loss_function[1])(*best_constant,uVar7,all->loss,all->sd);
      fVar15 = fVar13 * extraout_XMM0_Da_00;
      fVar8 = *best_constant_loss;
    }
    fVar13 = (fVar8 + fVar15) / local_9c;
  }
  else {
    fVar13 = 1.1754944e-38;
  }
  *best_constant_loss = fVar13;
  bVar6 = true;
LAB_001cf75c:
  std::__cxx11::string::~string(local_88);
  return bVar6;
}

Assistant:

bool get_best_constant(vw& all, float& best_constant, float& best_constant_loss)
{
  if (all.sd->first_observed_label == FLT_MAX ||  // no non-test labels observed or function was never called
      (all.loss == nullptr) || (all.sd == nullptr))
    return false;

  float label1 = all.sd->first_observed_label;  // observed labels might be inside [sd->Min_label, sd->Max_label], so
                                                // can't use Min/Max
  float label2 = (all.sd->second_observed_label == FLT_MAX)
      ? 0
      : all.sd->second_observed_label;  // if only one label observed, second might be 0
  if (label1 > label2)
  {
    float tmp = label1;
    label1 = label2;
    label2 = tmp;
  }  // as don't use min/max - make sure label1 < label2

  float label1_cnt;
  float label2_cnt;

  if (label1 != label2)
  {
    label1_cnt = (float)(all.sd->weighted_labels - label2 * all.sd->weighted_labeled_examples) / (label1 - label2);
    label2_cnt = (float)all.sd->weighted_labeled_examples - label1_cnt;
  }
  else
    return false;

  if ((label1_cnt + label2_cnt) <= 0.)
    return false;

  auto funcName = all.loss->getType();
  if (funcName.compare("squared") == 0 || funcName.compare("Huber") == 0 || funcName.compare("classic") == 0)
    best_constant = (float)all.sd->weighted_labels / (float)(all.sd->weighted_labeled_examples);
  else if (all.sd->is_more_than_two_labels_observed)
  {
    // loss functions below don't have generic formuas for constant yet.
    return false;
  }
  else if (funcName.compare("hinge") == 0)
  {
    best_constant = label2_cnt <= label1_cnt ? -1.f : 1.f;
  }
  else if (funcName.compare("logistic") == 0)
  {
    label1 = -1.;  // override {-50, 50} to get proper loss
    label2 = 1.;

    if (label1_cnt <= 0)
      best_constant = 1.;
    else if (label2_cnt <= 0)
      best_constant = -1.;
    else
      best_constant = log(label2_cnt / label1_cnt);
  }
  else if (funcName.compare("quantile") == 0 || funcName.compare("pinball") == 0 || funcName.compare("absolute") == 0)
  {
    float tau = 0.5;

    if (all.options->was_supplied("quantile_tau"))
      tau = all.options->get_typed_option<float>("quantile_tau").value();

    float q = tau * (label1_cnt + label2_cnt);
    if (q < label2_cnt)
      best_constant = label2;
    else
      best_constant = label1;
  }
  else
    return false;

  if (!all.sd->is_more_than_two_labels_observed)
  {
    best_constant_loss = (label1_cnt > 0) ? all.loss->getLoss(all.sd, best_constant, label1) * label1_cnt : 0.0f;
    best_constant_loss += (label2_cnt > 0) ? all.loss->getLoss(all.sd, best_constant, label2) * label2_cnt : 0.0f;
    best_constant_loss /= label1_cnt + label2_cnt;
  }
  else
    best_constant_loss = FLT_MIN;

  return true;
}